

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkDupDfs(Wlc_Ntk_t *p,int fMarked,int fSeq)

{
  ushort uVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *pVVar4;
  Wlc_Ntk_t *pNew;
  Wlc_Obj_t *pWVar5;
  Wlc_Obj_t *pWVar6;
  char *pcVar7;
  uint fFlopInput;
  int i;
  int iVar8;
  
  pVVar4 = Vec_IntAlloc(100);
  Wlc_NtkCleanCopy(p);
  pNew = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  iVar8 = p->fAsyncRst;
  iVar2 = p->fMemPorts;
  iVar3 = p->fEasyFfs;
  pNew->fSmtLib = p->fSmtLib;
  pNew->fAsyncRst = iVar8;
  pNew->fMemPorts = iVar2;
  pNew->fEasyFfs = iVar3;
  for (iVar8 = 0; iVar8 < (p->vCis).nSize; iVar8 = iVar8 + 1) {
    pWVar5 = Wlc_NtkCi(p,iVar8);
    uVar1 = *(ushort *)pWVar5;
    if ((fMarked == 0) || ((uVar1 & 0x80) != 0)) {
      if (fSeq == 0) {
        *(ushort *)pWVar5 = (uVar1 & 0xffc0) + 1;
      }
      Wlc_ObjDup(pNew,p,(int)(((long)pWVar5 - (long)p->pObjs) / 0x18),pVVar4);
      *(ushort *)pWVar5 = uVar1 & 0x3f | (ushort)*(undefined4 *)pWVar5 & 0xffc0;
    }
  }
  for (iVar8 = 0; iVar8 < (p->vFfs2).nSize; iVar8 = iVar8 + 1) {
    pWVar5 = Wlc_NtkFf2(p,iVar8);
    iVar2 = Wlc_ObjAlloc(pNew,*(ushort *)pWVar5 & 0x3f,*(ushort *)pWVar5 >> 6 & 1,pWVar5->End,
                         pWVar5->Beg);
    Vec_IntWriteEntry(&p->vCopies,(int)(((long)pWVar5 - (long)p->pObjs) / 0x18),iVar2);
    Vec_IntPush(&pNew->vFfs2,iVar2);
  }
  for (iVar8 = 0; iVar2 = (p->vCos).nSize, iVar8 < iVar2; iVar8 = iVar8 + 1) {
    pWVar5 = Wlc_NtkCo(p,iVar8);
    if ((fMarked == 0) ||
       ((undefined1  [24])((undefined1  [24])*pWVar5 & (undefined1  [24])0x80) !=
        (undefined1  [24])0x0)) {
      Wlc_NtkDupDfs_rec(pNew,p,(int)(((long)pWVar5 - (long)p->pObjs) / 0x18),pVVar4);
    }
  }
  for (iVar8 = 0; iVar8 < iVar2; iVar8 = iVar8 + 1) {
    pWVar5 = Wlc_NtkCo(p,iVar8);
    if ((fMarked == 0) ||
       ((undefined1  [24])((undefined1  [24])*pWVar5 & (undefined1  [24])0x80) !=
        (undefined1  [24])0x0)) {
      pWVar6 = Wlc_ObjCopyObj(pNew,p,pWVar5);
      if (fSeq == 0) {
        fFlopInput = 0;
      }
      else {
        fFlopInput = *(uint *)pWVar5 >> 10 & 1;
      }
      Wlc_ObjSetCo(pNew,pWVar6,fFlopInput);
    }
    iVar2 = (p->vCos).nSize;
  }
  for (iVar8 = 0; iVar8 < (p->vFfs2).nSize; iVar8 = iVar8 + 1) {
    pWVar6 = Wlc_NtkFf2(p,iVar8);
    pWVar5 = p->pObjs;
    for (iVar2 = 0; iVar2 < (int)pWVar6->nFanins; iVar2 = iVar2 + 1) {
      iVar3 = Wlc_ObjFaninId(pWVar6,iVar2);
      Wlc_NtkDupDfs_rec(pNew,p,iVar3,pVVar4);
    }
    iVar2 = (int)(((long)pWVar6 - (long)pWVar5) / 0x18);
    Wlc_ObjCollectCopyFanins(p,iVar2,pVVar4);
    iVar2 = Vec_IntEntry(&p->vCopies,iVar2);
    pWVar5 = Wlc_NtkObj(pNew,iVar2);
    Wlc_ObjAddFanins(pNew,pWVar5,pVVar4);
    *(ushort *)pWVar5 = (ushort)*(undefined4 *)pWVar5 & 0xf7ff | *(ushort *)pWVar6 & 0x800;
  }
  Vec_IntFree(pVVar4);
  if ((fSeq != 0) && (pVVar4 = p->vInits, pVVar4 != (Vec_Int_t *)0x0)) {
    if (fMarked == 0) {
      pVVar4 = Vec_IntDup(pVVar4);
      pNew->vInits = pVVar4;
      if (p->pInits == (char *)0x0) goto LAB_0030d0b6;
      pcVar7 = Abc_UtilStrsav(p->pInits);
    }
    else {
      pVVar4 = Wlc_ReduceMarkedInitVec(p,pVVar4);
      pNew->vInits = pVVar4;
      if (p->pInits == (char *)0x0) goto LAB_0030d0b6;
      pcVar7 = Wlc_ReduceMarkedInitStr(p,p->pInits);
    }
    pNew->pInits = pcVar7;
  }
LAB_0030d0b6:
  if (p->pSpec != (char *)0x0) {
    pcVar7 = Abc_UtilStrsav(p->pSpec);
    pNew->pSpec = pcVar7;
  }
  if (0 < (p->vNameIds).nSize) {
    Wlc_NtkTransferNames(pNew,p);
  }
  iVar8 = (p->vPoPairs).nSize;
  if (iVar8 != 0) {
    for (iVar2 = 0; iVar2 < iVar8; iVar2 = iVar2 + 1) {
      iVar8 = Vec_IntEntry(&p->vPoPairs,iVar2);
      Vec_IntPush(&pNew->vPoPairs,iVar8);
      iVar8 = (p->vPoPairs).nSize;
    }
  }
  return pNew;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupDfs( Wlc_Ntk_t * p, int fMarked, int fSeq )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj, * pObjNew;
    Vec_Int_t * vFanins;
    int i, k, iObj, iFanin;
    vFanins = Vec_IntAlloc( 100 );
    Wlc_NtkCleanCopy( p );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    pNew->fSmtLib = p->fSmtLib;
    pNew->fAsyncRst = p->fAsyncRst;
    pNew->fMemPorts = p->fMemPorts;
    pNew->fEasyFfs = p->fEasyFfs;
    Wlc_NtkForEachCi( p, pObj, i )
        if ( !fMarked || pObj->Mark )
        {
            unsigned Type = pObj->Type;
            if ( !fSeq ) pObj->Type = WLC_OBJ_PI;
            Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
            pObj->Type = Type;
        }
    Wlc_NtkForEachFf2( p, pObj, i )
    {
        int iObjNew = Wlc_ObjAlloc( pNew, pObj->Type, Wlc_ObjIsSigned(pObj), pObj->End, pObj->Beg );
        Wlc_ObjSetCopy( p, Wlc_ObjId(p, pObj), iObjNew );
        Vec_IntPush( &pNew->vFfs2, iObjNew );
    }
    Wlc_NtkForEachCo( p, pObj, i )
        if ( !fMarked || pObj->Mark )
            Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        if ( !fMarked || pObj->Mark )
            Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), fSeq ? pObj->fIsFi : 0 );
    Wlc_NtkForEachFf2( p, pObj, i )
    {
        iObj = Wlc_ObjId(p, pObj);
        Wlc_ObjForEachFanin( pObj, iFanin, k )
            Wlc_NtkDupDfs_rec( pNew, p, iFanin, vFanins );
        Wlc_ObjCollectCopyFanins( p, iObj, vFanins );
        pObjNew = Wlc_NtkObj( pNew, Wlc_ObjCopy(p, iObj) );
        Wlc_ObjAddFanins( pNew, pObjNew, vFanins );
        pObjNew->fXConst = pObj->fXConst;
    }
    Vec_IntFree( vFanins );
    if ( fSeq && p->vInits )
    {
        if ( fMarked )
        {
            if ( p->vInits )
                pNew->vInits = Wlc_ReduceMarkedInitVec( p, p->vInits );
            if ( p->pInits )
                pNew->pInits = Wlc_ReduceMarkedInitStr( p, p->pInits );
        }
        else
        {
            if ( p->vInits )
                pNew->vInits = Vec_IntDup( p->vInits );
            if ( p->pInits )
                pNew->pInits = Abc_UtilStrsav( p->pInits );
        }
    }
    if ( p->pSpec )
        pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    if ( Wlc_NtkHasNameId(p) )
        Wlc_NtkTransferNames( pNew, p );
    if ( Vec_IntSize(&p->vPoPairs) )
        Vec_IntAppend( &pNew->vPoPairs, &p->vPoPairs );
    return pNew;
}